

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::CreateGeneratorTargets
          (cmGlobalGenerator *this,TargetTypes targetTypes,cmMakefile *mf,cmLocalGenerator *lg,
          map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
          *importedMap)

{
  bool bVar1;
  pointer ppVar2;
  cmGeneratorTarget *this_00;
  reference __x;
  pointer ppVar3;
  _Rb_tree_const_iterator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_> local_a0;
  __normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_> local_98;
  __normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_> local_90;
  __normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
  local_88;
  const_iterator j;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> itgts;
  cmGeneratorTarget *gt;
  cmTarget *t;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
  local_40;
  iterator ti;
  cmTargets *targets;
  map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
  *importedMap_local;
  cmLocalGenerator *lg_local;
  cmMakefile *mf_local;
  TargetTypes targetTypes_local;
  cmGlobalGenerator *this_local;
  
  if (targetTypes == AllTargets) {
    ti.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
    ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
               )cmMakefile::GetTargets_abi_cxx11_(mf);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
         ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                  *)ti.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                    ._M_cur);
    while( true ) {
      t = (cmTarget *)
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
          ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>_>
                 *)ti.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                   ._M_cur);
      bVar1 = std::__detail::operator!=
                        (&local_40,
                         (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_true>
                          *)&t);
      if (!bVar1) break;
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                             *)&local_40);
      this_00 = (cmGeneratorTarget *)operator_new(0x500);
      cmGeneratorTarget::cmGeneratorTarget(this_00,&ppVar2->second,lg);
      cmLocalGenerator::AddGeneratorTarget(lg,this_00);
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_false,_true>
                    *)&local_40);
    }
  }
  cmMakefile::GetImportedTargets((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)&j,mf);
  local_90._M_current =
       (cmTarget **)
       std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::begin
                 ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)&j);
  __gnu_cxx::__normal_iterator<cmTarget*const*,std::vector<cmTarget*,std::allocator<cmTarget*>>>::
  __normal_iterator<cmTarget**>
            ((__normal_iterator<cmTarget*const*,std::vector<cmTarget*,std::allocator<cmTarget*>>> *)
             &local_88,&local_90);
  while( true ) {
    local_98._M_current =
         (cmTarget **)
         std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::end
                   ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)&j);
    bVar1 = __gnu_cxx::operator!=(&local_88,&local_98);
    if (!bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
          ::operator*(&local_88);
    local_a0._M_node =
         (_Base_ptr)
         std::
         map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
         ::find(importedMap,__x);
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>::
             operator->(&local_a0);
    cmLocalGenerator::AddImportedGeneratorTarget(lg,ppVar3->second);
    __gnu_cxx::
    __normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>::
    operator++(&local_88);
  }
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::~vector
            ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)&j);
  return;
}

Assistant:

void cmGlobalGenerator::CreateGeneratorTargets(
    TargetTypes targetTypes,
    cmMakefile *mf,
    cmLocalGenerator *lg,
    std::map<cmTarget*, cmGeneratorTarget*> const& importedMap)
{
  if (targetTypes == AllTargets)
    {
    cmTargets& targets = mf->GetTargets();
    for(cmTargets::iterator ti = targets.begin();
        ti != targets.end(); ++ti)
      {
      cmTarget* t = &ti->second;
      cmGeneratorTarget* gt = new cmGeneratorTarget(t, lg);
      lg->AddGeneratorTarget(gt);
      }
    }

  std::vector<cmTarget*> itgts = mf->GetImportedTargets();

  for(std::vector<cmTarget*>::const_iterator
        j = itgts.begin(); j != itgts.end(); ++j)
    {
    lg->AddImportedGeneratorTarget(importedMap.find(*j)->second);
    }
}